

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
inner_enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 *element)

{
  ulong uVar1;
  __pointer_type pBVar2;
  bool bVar3;
  ImplicitProducer *this_00;
  Block *pBVar4;
  ulong uVar5;
  BlockIndexEntry *pBVar6;
  
  this_00 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
            ::get_or_add_implicit_producer
                      ((ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                        *)this);
  if (this_00 != (ImplicitProducer *)0x0) {
    uVar1 = (this_00->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    if ((uVar1 & 0x1f) != 0) {
      pBVar4 = (this_00->super_ProducerBase).tailBlock;
LAB_0016c670:
      *(coro_http_client **)(pBVar4->elements + (uVar1 & 0x1f) * 8) =
           (element->_M_t).
           super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
           ._M_t.
           super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
           .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl;
      (element->_M_t).
      super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
      ._M_t.
      super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
      .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl =
           (coro_http_client *)0x0;
      (this_00->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
      return true;
    }
    if ((((this_00->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i - uVar1) +
         0x7fffffffffffffdf < 0x7fffffffffffffff) &&
       (pBVar2 = (this_00->blockIndex)._M_b._M_p, pBVar2 != (__pointer_type)0x0)) {
      uVar5 = pBVar2->capacity - 1 & (pBVar2->tail).super___atomic_base<unsigned_long>._M_i + 1;
      pBVar6 = pBVar2->index[uVar5];
      if (((pBVar6->key).super___atomic_base<unsigned_long>._M_i == 1) ||
         ((pBVar6->value)._M_b._M_p == (__pointer_type)0x0)) {
        (pBVar6->key).super___atomic_base<unsigned_long>._M_i = uVar1;
        (pBVar2->tail).super___atomic_base<unsigned_long>._M_i = uVar5;
      }
      else {
        bVar3 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                ::ImplicitProducer::new_block_index(this_00);
        if (!bVar3) {
          return false;
        }
        pBVar2 = (this_00->blockIndex)._M_b._M_p;
        uVar5 = pBVar2->capacity - 1 & (pBVar2->tail).super___atomic_base<unsigned_long>._M_i + 1;
        pBVar6 = pBVar2->index[uVar5];
        (pBVar6->key).super___atomic_base<unsigned_long>._M_i = uVar1;
        (pBVar2->tail).super___atomic_base<unsigned_long>._M_i = uVar5;
      }
      pBVar4 = requisition_block<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                         ((ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                           *)(this_00->super_ProducerBase).parent);
      if (pBVar4 != (Block *)0x0) {
        (pBVar4->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
        (pBVar6->value)._M_b._M_p = pBVar4;
        (this_00->super_ProducerBase).tailBlock = pBVar4;
        goto LAB_0016c670;
      }
      pBVar2 = (this_00->blockIndex)._M_b._M_p;
      (pBVar2->tail).super___atomic_base<unsigned_long>._M_i =
           pBVar2->capacity - 1 & (pBVar2->tail).super___atomic_base<unsigned_long>._M_i - 1;
      (pBVar6->value)._M_b._M_p = (__pointer_type)0x0;
    }
  }
  return false;
}

Assistant:

inline bool inner_enqueue(U&& element) {
    auto producer = get_or_add_implicit_producer();
    return producer == nullptr
               ? false
               : producer->ConcurrentQueue::ImplicitProducer::template enqueue<
                     canAlloc>(std::forward<U>(element));
  }